

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

void __thiscall I2sAnalyzer::WorkerThread(I2sAnalyzer *this)

{
  element_type *peVar1;
  AnalyzerChannelData *pAVar2;
  I2sAnalyzer *this_local;
  
  peVar1 = std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  if (peVar1->mDataValidEdge == NegEdge) {
    this->mArrowMarker = DownArrow;
  }
  else {
    this->mArrowMarker = UpArrow;
  }
  std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mClock = pAVar2;
  std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mFrame = pAVar2;
  std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  pAVar2 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mData = pAVar2;
  SetupForGettingFirstBit(this);
  SetupForGettingFirstFrame(this);
  do {
    GetFrame(this);
    AnalyzeFrame(this);
    std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
    AnalyzerResults::CommitResults();
    AnalyzerChannelData::GetSampleNumber();
    Analyzer::ReportProgress((ulonglong)this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void I2sAnalyzer::WorkerThread()
{
    // UpArrow, DownArrow
    if( mSettings->mDataValidEdge == AnalyzerEnums::NegEdge )
        mArrowMarker = AnalyzerResults::DownArrow;
    else
        mArrowMarker = AnalyzerResults::UpArrow;

    mClock = GetAnalyzerChannelData( mSettings->mClockChannel );
    mFrame = GetAnalyzerChannelData( mSettings->mFrameChannel );
    mData = GetAnalyzerChannelData( mSettings->mDataChannel );

    SetupForGettingFirstBit();
    SetupForGettingFirstFrame();

    for( ;; )
    {
        GetFrame();
        AnalyzeFrame();

        mResults->CommitResults();
        ReportProgress( mClock->GetSampleNumber() );
        CheckIfThreadShouldExit();
    }
}